

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
          (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
           *this,char (*args) [9])

{
  simple_collector<(pybind11::return_value_policy)1> *in_RDX;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_> *in_RSI;
  handle in_RDI;
  char (*in_stack_ffffffffffffffa8) [9];
  PyObject *in_stack_ffffffffffffffe0;
  
  collect_arguments<(pybind11::return_value_policy)1,char_const(&)[9],void>
            (in_stack_ffffffffffffffa8);
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>::derived
            (in_RSI);
  accessor<pybind11::detail::accessor_policies::str_attr>::ptr
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x2ec40b);
  simple_collector<(pybind11::return_value_policy)1>::call(in_RDX,in_stack_ffffffffffffffe0);
  simple_collector<(pybind11::return_value_policy)1>::~simple_collector
            ((simple_collector<(pybind11::return_value_policy)1> *)0x2ec432);
  return (object)(handle)in_RDI.m_ptr;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
#ifndef NDEBUG
    if (!PyGILState_Check()) {
        pybind11_fail("pybind11::object_api<>::operator() PyGILState_Check() failure.");
    }
#endif
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}